

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O2

lysp_node_action * lysp_node_actions(lysp_node *node)

{
  lysp_node_action **pplVar1;
  lysp_node_action *plVar2;
  
  pplVar1 = lysp_node_actions_p(node);
  if (pplVar1 == (lysp_node_action **)0x0) {
    plVar2 = (lysp_node_action *)0x0;
  }
  else {
    plVar2 = *pplVar1;
  }
  return plVar2;
}

Assistant:

lysp_node_action *
lysp_node_actions(const struct lysp_node *node)
{
    struct lysp_node_action **actions;

    actions = lysp_node_actions_p((struct lysp_node *)node);
    if (actions) {
        return *actions;
    } else {
        return NULL;
    }
}